

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fog.cpp
# Opt level: O0

int AF_A_FogSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  bool local_86;
  bool local_83;
  TAngle<double> local_80;
  DVector3 local_78;
  FName local_60;
  int local_5c;
  AActor *pAStack_58;
  int delta;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                  ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_83 = true;
    if (stateowner != (AActor *)0x0) {
      local_83 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_83 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                    ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                      ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_86 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_86 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_86 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                      ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                      ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      mo = (AActor *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    pAStack_58 = (AActor *)0x0;
    iVar1 = stateowner->special1;
    stateowner->special1 = iVar1 + -1;
    if (iVar1 < 1) {
      stateowner->special1 = stateowner->args[2];
      iVar1 = FRandom::operator()(&pr_fogspawn);
      FName::FName(&local_60,AF_A_FogSpawn::fogs[iVar1 % 3]);
      AActor::Pos(&local_78,stateowner);
      pAStack_58 = Spawn(&local_60,&local_78,ALLOW_REPLACE);
      if (pAStack_58 != (AActor *)0x0) {
        local_5c = stateowner->args[1];
        if (local_5c == 0) {
          local_5c = 1;
        }
        iVar1 = FRandom::operator()(&pr_fogspawn);
        TAngle<double>::operator+(&local_80,(double)(iVar1 % local_5c - (local_5c >> 1)) * 1.40625);
        TAngle<double>::operator=(&(pAStack_58->Angles).Yaw,&local_80);
        TObjPtr<AActor>::operator=(&pAStack_58->target,stateowner);
        if (stateowner->args[0] < 1) {
          stateowner->args[0] = 1;
        }
        iVar1 = FRandom::operator()(&pr_fogspawn);
        pAStack_58->args[0] = iVar1 % stateowner->args[0] + 1;
        pAStack_58->args[3] = stateowner->args[3];
        pAStack_58->args[4] = 1;
        iVar1 = FRandom::operator()(&pr_fogspawn);
        pAStack_58->WeaveIndexZ = (byte)iVar1 & 0x3f;
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FogSpawn)
{
	PARAM_ACTION_PROLOGUE;

	static const char *fogs[3] =
	{
		"FogPatchSmall",
		"FogPatchMedium",
		"FogPatchLarge"
	};

	AActor *mo = NULL;
	int delta;

	if (self->special1-- > 0)
	{
		return 0;
	}
	self->special1 = self->args[2];		// Reset frequency count

	mo = Spawn (fogs[pr_fogspawn()%3], self->Pos(), ALLOW_REPLACE);

	if (mo)
	{
		delta = self->args[1];
		if (delta==0) delta=1;
		mo->Angles.Yaw = self->Angles.Yaw + (((pr_fogspawn() % delta) - (delta >> 1)) * (360 / 256.));
		mo->target = self;
		if (self->args[0] < 1) self->args[0] = 1;
		mo->args[0] = (pr_fogspawn() % (self->args[0]))+1;	// Random speed
		mo->args[3] = self->args[3];						// Set lifetime
		mo->args[4] = 1;									// Set to moving
		mo->WeaveIndexZ = pr_fogspawn()&63;
	}
	return 0;
}